

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveRowsNewBranch(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  QChar local_1e4;
  QChar local_1e2;
  value_type args;
  GenericModel testModel;
  anon_union_24_3_e3d07ef4_for_data local_1a8;
  QModelIndex parIndex;
  QPersistentModelIndex twoIndex;
  QModelIndex destIndex;
  QSignalSpy *spyArr [2];
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy rowsMovedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  ModelTest::ModelTest(&probe,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x3);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&parIndex,(int)&testModel,(QModelIndex *)0x1);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&destIndex,(int)&testModel,(QModelIndex *)0x2);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeMovedSpy,(QObject *)&testModel,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeMovedSpy.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x712);
  if (cVar2 == '\0') goto LAB_00121718;
  QSignalSpy::QSignalSpy
            (&rowsMovedSpy,(QObject *)&testModel,
             "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsMovedSpy.sig.d.size != 0,"rowsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x714);
  if (cVar2 != '\0') {
    spyArr[0] = &rowsAboutToBeMovedSpy;
    spyArr[1] = &rowsMovedSpy;
    for (uVar6 = 0; uVar6 != 6; uVar6 = uVar6 + 1) {
      iVar7 = (int)(QModelIndex *)&testModel;
      iVar8 = (int)&local_1a8;
      GenericModel::index(iVar8,iVar7,(QModelIndex *)(ulong)uVar6);
      QVariant::QVariant((QVariant *)&args,uVar6);
      iVar5 = (int)(QVariant *)&args;
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_1a8,iVar5);
      QVariant::~QVariant((QVariant *)&args);
      GenericModel::index(iVar8,iVar7,(QModelIndex *)(ulong)uVar6);
      QVariant::QVariant((QVariant *)&args,(QChar)((short)uVar6 + L'a'));
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_1a8,iVar5);
      QVariant::~QVariant((QVariant *)&args);
    }
    bVar3 = GenericModel::moveRows
                      ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,(int)&destIndex
                      );
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 2, 1, destIndex, -1)",""
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x71a);
    if (cVar2 != '\0') {
      lVar9 = 0;
      do {
        if (lVar9 == 0x10) {
          bVar3 = GenericModel::moveRows
                            ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                             (int)&destIndex);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveRows(parIndex, 2, 1, destIndex, 1)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x71d);
          if (cVar2 != '\0') {
            lVar9 = 0;
            goto LAB_00120c90;
          }
          break;
        }
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar9) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x71c);
        lVar9 = lVar9 + 8;
      } while (cVar2 != '\0');
    }
  }
  goto LAB_0012170b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar9) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x71f);
    lVar9 = lVar9 + 8;
    if (cVar2 == '\0') break;
LAB_00120c90:
    if (lVar9 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,-1,(QModelIndex *)0x1,
                         (int)&destIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, -1, 1, destIndex, 0)",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x720);
      if (cVar2 != '\0') {
        lVar9 = 0;
        goto LAB_00120d27;
      }
      break;
    }
  }
  goto LAB_0012170b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar9) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x722);
    lVar9 = lVar9 + 8;
    if (cVar2 == '\0') break;
LAB_00120d27:
    if (lVar9 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,6,(QModelIndex *)0x1,
                         (int)&destIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 6, 1, destIndex, 0)",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x723);
      if (cVar2 != '\0') {
        lVar9 = 0;
        goto LAB_00120dbe;
      }
      break;
    }
  }
  goto LAB_0012170b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar9) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x725);
    lVar9 = lVar9 + 8;
    if (cVar2 == '\0') break;
LAB_00120dbe:
    if (lVar9 == 0x10) {
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::QPersistentModelIndex(&twoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                               (int)&destIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 2, 1, destIndex, 0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x728);
      if (cVar2 == '\0') goto LAB_00121701;
      iVar5 = GenericModel::rowCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar5,1,"testModel.rowCount(destIndex)","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x729);
      if (cVar2 == '\0') goto LAB_00121701;
      iVar5 = GenericModel::columnCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar5,2,"testModel.columnCount(destIndex)","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x72a);
      if (cVar2 == '\0') goto LAB_00121701;
      iVar5 = GenericModel::rowCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar5,5,"testModel.rowCount(parIndex)","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x72b);
      if (cVar2 == '\0') goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,2,"testModel.index(0, 0, destIndex).data().toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x72c);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,0,"testModel.index(0, 0, parIndex).data().toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x72d);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,1,"testModel.index(1, 0, parIndex).data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x72e);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,3,"testModel.index(2, 0, parIndex).data().toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x72f);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,4,"testModel.index(3, 0, parIndex).data().toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x730);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,5,"testModel.index(4, 0, parIndex).data().toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x731);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(0, 1, destIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x732);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'a';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(0, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'a\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x733);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'b';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(1, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x734);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'd';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(2, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'d\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x735);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'e';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(3, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'e\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x736);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00121701;
      GenericModel::index((int)&local_1a8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1a8,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'f';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(4, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'f\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x737);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00121701;
      QPersistentModelIndex::data((int)&args);
      local_1a8._0_2_ = qvariant_cast<QChar>((QVariant *)&args);
      local_1e4.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&local_1a8,&local_1e4,"twoIndex.data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x738);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00121701;
      iVar5 = QPersistentModelIndex::row();
      cVar2 = QTest::qCompare(iVar5,0,"twoIndex.row()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x739);
      if (cVar2 == '\0') goto LAB_00121701;
      QPersistentModelIndex::parent();
      bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                        ((QModelIndex *)&args,&destIndex,"twoIndex.parent()","destIndex",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x73a);
      if (!bVar4) goto LAB_00121701;
      lVar9 = 0;
      goto LAB_00121580;
    }
  }
  goto LAB_0012170b;
LAB_00121580:
  do {
    if (lVar9 == 0x10) break;
    lVar1 = *(long *)((long)spyArr + lVar9);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x73c);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>((QModelIndex *)&local_1a8,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      ((QModelIndex *)&local_1a8,&parIndex,"args.at(0).value<QModelIndex>()",
                       "parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x73e);
    if (!bVar4) {
LAB_001216f7:
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
      break;
    }
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x73f);
    if (cVar2 == '\0') goto LAB_001216f7;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x740);
    if (cVar2 == '\0') goto LAB_001216f7;
    qvariant_cast<QModelIndex>((QModelIndex *)&local_1a8,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      ((QModelIndex *)&local_1a8,&destIndex,"args.at(3).value<QModelIndex>()",
                       "destIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x741);
    if (!bVar4) goto LAB_001216f7;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,0,"args.at(4).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x742);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar9 = lVar9 + 8;
  } while (cVar2 != '\0');
LAB_00121701:
  QPersistentModelIndex::~QPersistentModelIndex(&twoIndex);
LAB_0012170b:
  QSignalSpy::~QSignalSpy(&rowsMovedSpy);
LAB_00121718:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeMovedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsNewBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    const QModelIndex destIndex = testModel.index(2, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    for (int i = 0; i < 6; ++i) {
        testModel.setData(testModel.index(i, 0, parIndex), i);
        testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
    }
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, 1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, destIndex, 0));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, destIndex, 0));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, destIndex, 0));
    QCOMPARE(testModel.rowCount(destIndex), 1);
    QCOMPARE(testModel.columnCount(destIndex), 2);
    QCOMPARE(testModel.rowCount(parIndex), 5);
    QCOMPARE(testModel.index(0, 0, destIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, destIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    QCOMPARE(twoIndex.parent(), destIndex);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), destIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }
}